

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr *ppxVar1;
  xmlXPathCompExprPtr comp;
  long lVar2;
  
  ppxVar1 = ctxt->valueTab;
  if (ppxVar1 != (xmlXPathObjectPtr *)0x0) {
    if (0 < ctxt->valueNr) {
      lVar2 = 0;
      do {
        if (ctxt->context == (xmlXPathContextPtr)0x0) {
          xmlXPathFreeObject(ctxt->valueTab[lVar2]);
        }
        else {
          xmlXPathReleaseObject(ctxt->context,ctxt->valueTab[lVar2]);
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < ctxt->valueNr);
      ppxVar1 = ctxt->valueTab;
    }
    (*xmlFree)(ppxVar1);
  }
  comp = ctxt->comp;
  if (comp != (xmlXPathCompExprPtr)0x0) {
    if (comp->stream != (xmlPatternPtr)0x0) {
      xmlFreePatternList(comp->stream);
      comp = ctxt->comp;
      comp->stream = (xmlPatternPtr)0x0;
    }
    xmlXPathFreeCompExpr(comp);
  }
  (*xmlFree)(ctxt);
  return;
}

Assistant:

void
xmlXPathFreeParserContext(xmlXPathParserContextPtr ctxt) {
    int i;

    if (ctxt->valueTab != NULL) {
        for (i = 0; i < ctxt->valueNr; i++) {
            if (ctxt->context)
                xmlXPathReleaseObject(ctxt->context, ctxt->valueTab[i]);
            else
                xmlXPathFreeObject(ctxt->valueTab[i]);
        }
        xmlFree(ctxt->valueTab);
    }
    if (ctxt->comp != NULL) {
#ifdef XPATH_STREAMING
	if (ctxt->comp->stream != NULL) {
	    xmlFreePatternList(ctxt->comp->stream);
	    ctxt->comp->stream = NULL;
	}
#endif
	xmlXPathFreeCompExpr(ctxt->comp);
    }
    xmlFree(ctxt);
}